

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covCore.c
# Opt level: O2

void Abc_NtkCovCovers_rec(Cov_Man_t *p,Abc_Obj_t *pObj,Vec_Ptr_t *vBoundary)

{
  int iVar1;
  int *piVar2;
  void **ppvVar3;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pObj_01;
  Abc_Obj_t *pObj_02;
  Abc_Obj_t *pObj_03;
  int iVar4;
  Vec_Int_t *pVVar5;
  Vec_Int_t *pVVar6;
  Min_Cube_t *pMVar7;
  Min_Cube_t *pMVar8;
  Cov_Obj_t *pCVar9;
  Min_Cube_t **ppMVar10;
  Min_Cube_t *pMVar11;
  uint uVar12;
  byte bVar13;
  ulong uVar14;
  Min_Man_t *p_00;
  uint uVar15;
  Min_Cube_t *local_60;
  Min_Cube_t *local_58;
  
  if ((*(uint *)&pObj->field_0x14 & 0x30) != 0) {
    return;
  }
  *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 | 0x20;
  piVar2 = (pObj->vFanins).pArray;
  ppvVar3 = pObj->pNtk->vObjs->pArray;
  pObj_00 = (Abc_Obj_t *)ppvVar3[*piVar2];
  pObj_01 = (Abc_Obj_t *)ppvVar3[piVar2[1]];
  Abc_NtkCovCovers_rec(p,pObj_00,vBoundary);
  Abc_NtkCovCovers_rec(p,pObj_01,vBoundary);
  if ((((pObj_00->field_0x14 & 0x10) == 0) &&
      (pVVar5 = Abc_ObjGetSupp(pObj_00), pVVar5 == (Vec_Int_t *)0x0)) ||
     (((pObj_01->field_0x14 & 0x10) == 0 &&
      (pVVar5 = Abc_ObjGetSupp(pObj_01), pVVar5 == (Vec_Int_t *)0x0)))) goto LAB_003a7402;
  piVar2 = (pObj->vFanins).pArray;
  ppvVar3 = pObj->pNtk->vObjs->pArray;
  pObj_02 = (Abc_Obj_t *)ppvVar3[*piVar2];
  pObj_03 = (Abc_Obj_t *)ppvVar3[piVar2[1]];
  if ((pObj_02->field_0x14 & 0x10) != 0) {
    Vec_IntWriteEntry(p->vTriv0,0,pObj_02->Id);
  }
  if ((pObj_03->field_0x14 & 0x10) != 0) {
    Vec_IntWriteEntry(p->vTriv1,0,pObj_03->Id);
  }
  if ((pObj_02->field_0x14 & 0x10) == 0) {
    pVVar5 = Abc_ObjGetSupp(pObj_02);
  }
  else {
    pVVar5 = p->vTriv0;
  }
  if ((pObj_03->field_0x14 & 0x10) == 0) {
    pVVar6 = Abc_ObjGetSupp(pObj_03);
  }
  else {
    pVVar6 = p->vTriv1;
  }
  pVVar5 = Abc_NodeCovSupport(p,pVVar5,pVVar6);
  iVar4 = pVVar5->nSize;
  if (p->nFaninMax < iVar4) {
    Vec_IntFree(pVVar5);
    goto LAB_003a7402;
  }
  uVar12 = *(uint *)&pObj->field_0x14 >> 10 & 1;
  uVar15 = *(uint *)&pObj->field_0x14 >> 0xb & 1;
  if (p->fUseEsop == 0) {
    local_58 = (Min_Cube_t *)0x0;
  }
  else {
    if ((pObj_02->field_0x14 & 0x10) == 0) {
      pMVar7 = Abc_ObjGetCover2(pObj_02);
    }
    else {
      pMVar7 = p->pManMin->pTriv0[0];
    }
    if ((pObj_03->field_0x14 & 0x10) == 0) {
      pMVar8 = Abc_ObjGetCover2(pObj_03);
    }
    else {
      pMVar8 = p->pManMin->pTriv1[0];
    }
    local_58 = (Min_Cube_t *)0x0;
    if ((pMVar7 != (Min_Cube_t *)0x0) && (pMVar8 != (Min_Cube_t *)0x0)) {
      pMVar11 = pMVar7;
      if (uVar12 != 0) {
        if (*(uint *)&pMVar7->field_0x8 < 0x400000) {
          pMVar11 = pMVar7->pNext;
        }
        else {
          pMVar11 = p->pManMin->pOne0;
          pMVar11->pNext = pMVar7;
        }
      }
      pMVar7 = pMVar8;
      if (uVar15 != 0) {
        if (*(uint *)&pMVar8->field_0x8 < 0x400000) {
          pMVar7 = pMVar8->pNext;
        }
        else {
          pMVar7 = p->pManMin->pOne1;
          pMVar7->pNext = pMVar8;
        }
      }
      local_58 = Abc_NodeCovProduct(p,pMVar11,pMVar7,1,iVar4);
    }
  }
  if (p->fUseSop == 0) {
    local_60 = (Min_Cube_t *)0x0;
LAB_003a73a8:
    pMVar8 = (Min_Cube_t *)0x0;
  }
  else {
    if ((pObj_02->field_0x14 & 0x10) == 0) {
      pCVar9 = Abc_ObjGetStr(pObj_02);
      ppMVar10 = pCVar9->pCover + uVar12;
    }
    else {
      ppMVar10 = p->pManMin->pTriv0 + uVar12;
    }
    pMVar7 = *ppMVar10;
    if ((pObj_03->field_0x14 & 0x10) == 0) {
      pCVar9 = Abc_ObjGetStr(pObj_03);
      ppMVar10 = pCVar9->pCover + uVar15;
    }
    else {
      ppMVar10 = p->pManMin->pTriv1 + uVar15;
    }
    local_60 = (Min_Cube_t *)0x0;
    if ((pMVar7 != (Min_Cube_t *)0x0) && (*ppMVar10 != (Min_Cube_t *)0x0)) {
      local_60 = Abc_NodeCovProduct(p,pMVar7,*ppMVar10,0,iVar4);
    }
    if ((pObj_02->field_0x14 & 0x10) == 0) {
      pCVar9 = Abc_ObjGetStr(pObj_02);
      ppMVar10 = pCVar9->pCover + (uVar12 ^ 1);
    }
    else {
      ppMVar10 = p->pManMin->pTriv0 + (uVar12 ^ 1);
    }
    pMVar7 = *ppMVar10;
    if ((pObj_03->field_0x14 & 0x10) == 0) {
      pCVar9 = Abc_ObjGetStr(pObj_03);
      ppMVar10 = pCVar9->pCover + (uVar15 ^ 1);
    }
    else {
      ppMVar10 = p->pManMin->pTriv1 + (uVar15 ^ 1);
    }
    pMVar8 = (Min_Cube_t *)0x0;
    if (pMVar7 != (Min_Cube_t *)0x0) {
      pMVar8 = *ppMVar10;
      if (pMVar8 == (Min_Cube_t *)0x0) goto LAB_003a73a8;
      Min_ManClean(p->pManMin,iVar4);
      for (; pMVar7 != (Min_Cube_t *)0x0; pMVar7 = pMVar7->pNext) {
        pMVar11 = Min_CubeAlloc(p->pManMin);
        uVar12 = *(uint *)&pMVar11->field_0x8 & 0x3fffff;
        *(uint *)&pMVar11->field_0x8 = uVar12;
        bVar13 = 0;
        for (uVar14 = 0; (long)uVar14 < (long)p->vComTo0->nSize; uVar14 = uVar14 + 1) {
          iVar1 = p->vComTo0->pArray[uVar14];
          if ((iVar1 != -1) &&
             (uVar15 = pMVar7->uData[iVar1 >> 4] >> ((char)iVar1 * '\x02' & 0x1fU) & 3, uVar15 != 3)
             ) {
            pMVar11->uData[uVar14 >> 4 & 0xfffffff] =
                 pMVar11->uData[uVar14 >> 4 & 0xfffffff] ^ (uVar15 ^ 3) << (bVar13 & 0x1e);
            uVar12 = uVar12 + 0x400000;
            *(uint *)&pMVar11->field_0x8 = uVar12;
          }
          bVar13 = bVar13 + 2;
        }
        p_00 = p->pManMin;
        if (p->nCubesMax < p_00->nCubes) goto LAB_003a73bb;
        Min_SopAddCube(p_00,pMVar11);
      }
      for (; pMVar8 != (Min_Cube_t *)0x0; pMVar8 = pMVar8->pNext) {
        pMVar7 = Min_CubeAlloc(p->pManMin);
        uVar12 = *(uint *)&pMVar7->field_0x8 & 0x3fffff;
        *(uint *)&pMVar7->field_0x8 = uVar12;
        bVar13 = 0;
        for (uVar14 = 0; (long)uVar14 < (long)p->vComTo1->nSize; uVar14 = uVar14 + 1) {
          iVar1 = p->vComTo1->pArray[uVar14];
          if ((iVar1 != -1) &&
             (uVar15 = pMVar8->uData[iVar1 >> 4] >> ((char)iVar1 * '\x02' & 0x1fU) & 3, uVar15 != 3)
             ) {
            pMVar7->uData[uVar14 >> 4 & 0xfffffff] =
                 pMVar7->uData[uVar14 >> 4 & 0xfffffff] ^ (uVar15 ^ 3) << (bVar13 & 0x1e);
            uVar12 = uVar12 + 0x400000;
            *(uint *)&pMVar7->field_0x8 = uVar12;
          }
          bVar13 = bVar13 + 2;
        }
        p_00 = p->pManMin;
        if (p->nCubesMax < p_00->nCubes) goto LAB_003a73bb;
        Min_SopAddCube(p_00,pMVar7);
      }
      Min_SopMinimize(p->pManMin);
      pMVar8 = Min_CoverCollect(p->pManMin,iVar4);
      iVar4 = Min_CoverCountCubes(pMVar8);
      if (p->nFaninMax < iVar4) goto LAB_003a73d1;
    }
  }
LAB_003a73e0:
  if (((pMVar8 != (Min_Cube_t *)0x0) || (local_58 != (Min_Cube_t *)0x0)) ||
     (local_60 != (Min_Cube_t *)0x0)) {
    pVVar6 = Abc_ObjGetSupp(pObj);
    if (pVVar6 == (Vec_Int_t *)0x0) {
      pCVar9 = Abc_ObjGetStr(pObj);
      pCVar9->vSupp = pVVar5;
      pCVar9 = Abc_ObjGetStr(pObj);
      pCVar9->pCover[0] = local_60;
      pCVar9 = Abc_ObjGetStr(pObj);
      pCVar9->pCover[1] = pMVar8;
      pCVar9 = Abc_ObjGetStr(pObj);
      pCVar9->pCover[2] = local_58;
      iVar4 = p->nSupps + 1;
      p->nSupps = iVar4;
      if (iVar4 < p->nSuppsMax) {
        iVar4 = p->nSuppsMax;
      }
      p->nSuppsMax = iVar4;
      return;
    }
    __assert_fail("Abc_ObjGetSupp(pObj) == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/cov/covCore.c"
                  ,0x1bb,"int Abc_NodeCovPropagate(Cov_Man_t *, Abc_Obj_t *)");
  }
  Vec_IntFree(pVVar5);
LAB_003a7402:
  if (((pObj_00->field_0x14 & 0x10) == 0) &&
     (pVVar5 = Abc_ObjGetSupp(pObj_00), pVVar5 != (Vec_Int_t *)0x0)) {
    Vec_PtrPush(vBoundary,pObj_00);
  }
  if (((pObj_01->field_0x14 & 0x10) == 0) &&
     (pVVar5 = Abc_ObjGetSupp(pObj_01), pVVar5 != (Vec_Int_t *)0x0)) {
    Vec_PtrPush(vBoundary,pObj_01);
    return;
  }
  return;
LAB_003a73bb:
  pMVar8 = Min_CoverCollect(p_00,iVar4);
LAB_003a73d1:
  Min_CoverRecycle(p->pManMin,pMVar8);
  pMVar8 = (Min_Cube_t *)0x0;
  goto LAB_003a73e0;
}

Assistant:

void Abc_NtkCovCovers_rec( Cov_Man_t * p, Abc_Obj_t * pObj, Vec_Ptr_t * vBoundary )
{
    Abc_Obj_t * pObj0, * pObj1;
    // return if the support is already computed
    if ( pObj->fMarkB || pObj->fMarkA )//|| Abc_ObjGetSupp(pObj) ) // why do we need Supp check here???
        return;
    // mark as visited
    pObj->fMarkB = 1;
    // get the fanins
    pObj0 = Abc_ObjFanin0(pObj);
    pObj1 = Abc_ObjFanin1(pObj);
    // solve for the fanins
    Abc_NtkCovCovers_rec( p, pObj0, vBoundary );
    Abc_NtkCovCovers_rec( p, pObj1, vBoundary );
    // skip the node that spaced out
    if ( (!pObj0->fMarkA && !Abc_ObjGetSupp(pObj0)) ||  // fanin is not ready
         (!pObj1->fMarkA && !Abc_ObjGetSupp(pObj1)) ||  // fanin is not ready
         !Abc_NodeCovPropagate( p, pObj ) )           // node's support or covers cannot be computed
    {
        // save the nodes of the future boundary
        if ( !pObj0->fMarkA && Abc_ObjGetSupp(pObj0) )
            Vec_PtrPush( vBoundary, pObj0 );
        if ( !pObj1->fMarkA && Abc_ObjGetSupp(pObj1) )
            Vec_PtrPush( vBoundary, pObj1 );
        return;
    }
    // consider dropping the fanin supports
//    Abc_NodeCovDropData( p, pObj0 );
//    Abc_NodeCovDropData( p, pObj1 );
}